

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcUtil.c
# Opt level: O2

void Abc_NtkCompareCones(Abc_Ntk_t *pNtk)

{
  uint uVar1;
  Vec_Ptr_t *p;
  void *pvVar2;
  Vec_Ptr_t *pVVar3;
  Vec_Ptr_t *p_00;
  void **ppvVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  Abc_Obj_t *pObj;
  uint local_4c;
  void *local_48;
  long local_40;
  Vec_Ptr_t *local_38;
  
  uVar9 = (ulong)pNtk->vCos->nSize;
  pvVar2 = malloc(uVar9 << 2);
  pSupps = (int *)malloc(uVar9 << 2);
  for (lVar10 = 0; lVar10 < (int)uVar9; lVar10 = lVar10 + 1) {
    pObj = Abc_NtkCo(pNtk,(int)lVar10);
    *(int *)((long)pvVar2 + lVar10 * 4) = (int)lVar10;
    pVVar3 = Abc_NtkNodeSupport(pNtk,&pObj,1);
    pSupps[lVar10] = pVVar3->nSize;
    Vec_PtrFree(pVVar3);
    uVar9 = (ulong)(uint)pNtk->vCos->nSize;
  }
  qsort(pvVar2,(long)(int)uVar9,4,Abc_NtkCompareConesCompare);
  local_4c = 0;
  local_48 = pvVar2;
  for (lVar10 = 0; lVar10 < pNtk->vCos->nSize; lVar10 = lVar10 + 1) {
    pObj = Abc_NtkCo(pNtk,(int)lVar10);
    pObj = Abc_NtkCo(pNtk,*(int *)((long)pvVar2 + lVar10 * 4));
    if ((pObj->field_0x14 & 0x10) == 0) {
      iVar5 = 1;
      pVVar3 = Abc_NtkNodeSupport(pNtk,&pObj,1);
      local_38 = Abc_NtkDfsNodes(pNtk,&pObj,1);
      p_00 = Abc_NtkDfsReverseNodesContained(pNtk,(Abc_Obj_t **)pVVar3->pArray,pVVar3->nSize);
      uVar9 = 0;
      while( true ) {
        p = local_38;
        uVar1 = p_00->nSize;
        if ((int)(uVar1 - 1) <= iVar5) break;
        for (pvVar2 = Vec_PtrEntry(p_00,iVar5); pvVar2 != (void *)0x0;
            pvVar2 = *(void **)((long)pvVar2 + 0x40)) {
          uVar9 = (ulong)((int)uVar9 + 1);
        }
        iVar5 = iVar5 + 1;
      }
      if ((int)uVar1 < 1) {
        __assert_fail("p->nSize > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecPtr.h"
                      ,0x1b7,"void *Vec_PtrEntryLast(Vec_Ptr_t *)");
      }
      uVar6 = local_4c + 1;
      uVar7 = 0;
      uVar8 = 0;
      ppvVar4 = p_00->pArray + ((ulong)uVar1 - 1);
      while (pvVar2 = *ppvVar4, pvVar2 != (void *)0x0) {
        uVar1 = *(uint *)((long)pvVar2 + 0x14);
        if ((uVar1 & 0xf) - 5 < 0xfffffffe) {
          __assert_fail("Abc_ObjIsCo(pTemp)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abc/abcUtil.c"
                        ,0x874,"void Abc_NtkCompareCones(Abc_Ntk_t *)");
        }
        uVar7 = (ulong)((int)uVar7 + 1);
        uVar8 = (ulong)((int)uVar8 + (uint)((uVar1 & 0x10) == 0));
        *(uint *)((long)pvVar2 + 0x14) = uVar1 | 0x10;
        ppvVar4 = (void **)((long)pvVar2 + 0x40);
      }
      local_4c = uVar6;
      local_40 = lVar10;
      printf("%4d CO %5d :  Supp = %5d.  Lev = %3d.  Cone = %5d.  Rev = %5d.  COs = %3d (%3d).\n",
             (ulong)uVar6,(ulong)*(uint *)((long)local_48 + lVar10 * 4),(ulong)(uint)pVVar3->nSize,
             (ulong)(*(uint *)((long)pObj->pNtk->vObjs->pArray[*(pObj->vFanins).pArray] + 0x14) >>
                    0xc),(ulong)(uint)local_38->nSize,uVar9,uVar7,uVar8);
      iVar5 = pVVar3->nSize;
      Vec_PtrFree(pVVar3);
      lVar10 = local_40;
      Vec_PtrFree(p);
      Vec_PtrFree(p_00);
      pvVar2 = local_48;
      if (iVar5 < 10) break;
    }
  }
  for (iVar5 = 0; iVar5 < pNtk->vCos->nSize; iVar5 = iVar5 + 1) {
    pObj = Abc_NtkCo(pNtk,iVar5);
    pObj->field_0x14 = pObj->field_0x14 & 0xef;
  }
  free(local_48);
  if (pSupps != (int *)0x0) {
    free(pSupps);
    pSupps = (int *)0x0;
  }
  return;
}

Assistant:

void Abc_NtkCompareCones( Abc_Ntk_t * pNtk )
{
    Vec_Ptr_t * vSupp, * vNodes, * vReverse;
    Abc_Obj_t * pObj, * pTemp;
    int Iter, i, k, Counter, CounterCos, CounterCosNew;
    int * pPerms;

    // sort COs by support size
    pPerms = ABC_ALLOC( int, Abc_NtkCoNum(pNtk) );
    pSupps = ABC_ALLOC( int, Abc_NtkCoNum(pNtk) );
    Abc_NtkForEachCo( pNtk, pObj, i )
    {
        pPerms[i] = i;
        vSupp = Abc_NtkNodeSupport( pNtk, &pObj, 1 );
        pSupps[i] = Vec_PtrSize(vSupp);
        Vec_PtrFree( vSupp );
    }
    qsort( (void *)pPerms, (size_t)Abc_NtkCoNum(pNtk), sizeof(int), (int (*)(const void *, const void *)) Abc_NtkCompareConesCompare );

    // consider COs in this order
    Iter = 0;
    Abc_NtkForEachCo( pNtk, pObj, i )
    {
        pObj = Abc_NtkCo( pNtk, pPerms[i] );
        if ( pObj->fMarkA )
            continue;
        Iter++;

        vSupp = Abc_NtkNodeSupport( pNtk, &pObj, 1 );
        vNodes = Abc_NtkDfsNodes( pNtk, &pObj, 1 );
        vReverse = Abc_NtkDfsReverseNodesContained( pNtk, (Abc_Obj_t **)Vec_PtrArray(vSupp), Vec_PtrSize(vSupp) );
        // count the number of nodes in the reverse cone
        Counter = 0;
        for ( k = 1; k < Vec_PtrSize(vReverse) - 1; k++ )
            for ( pTemp = (Abc_Obj_t *)Vec_PtrEntry(vReverse, k); pTemp; pTemp = (Abc_Obj_t *)pTemp->pCopy )
                Counter++;
        CounterCos = CounterCosNew = 0;
        for ( pTemp = (Abc_Obj_t *)Vec_PtrEntryLast(vReverse); pTemp; pTemp = (Abc_Obj_t *)pTemp->pCopy )
        {
            assert( Abc_ObjIsCo(pTemp) );
            CounterCos++;
            if ( pTemp->fMarkA == 0 )
                CounterCosNew++;
            pTemp->fMarkA = 1;
        }
        // print statistics
        printf( "%4d CO %5d :  Supp = %5d.  Lev = %3d.  Cone = %5d.  Rev = %5d.  COs = %3d (%3d).\n",
            Iter, pPerms[i], Vec_PtrSize(vSupp), Abc_ObjLevel(Abc_ObjFanin0(pObj)), Vec_PtrSize(vNodes), Counter, CounterCos, CounterCosNew );

        if ( Vec_PtrSize(vSupp) < 10 )
        {
            // free arrays
            Vec_PtrFree( vSupp );
            Vec_PtrFree( vNodes );
            Vec_PtrFree( vReverse );
            break;
        }

        // free arrays
        Vec_PtrFree( vSupp );
        Vec_PtrFree( vNodes );
        Vec_PtrFree( vReverse );

    }
    Abc_NtkForEachCo( pNtk, pObj, i )
        pObj->fMarkA = 0;

    ABC_FREE( pPerms );
    ABC_FREE( pSupps );
}